

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Thermo::getAngularMomentum(Thermo *this)

{
  SnapshotManager *this_00;
  Molecule *in_RSI;
  Snapshot *in_RDI;
  RealType thisMass;
  Vector3d thisp;
  Vector3d thisr;
  Molecule *mol;
  MoleculeIterator i;
  Vector3d angularMomentum;
  Vector3d comVel;
  Vector3d com;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffffe08;
  Snapshot *v1;
  MoleculeIterator *in_stack_fffffffffffffe28;
  SimInfo *in_stack_fffffffffffffe30;
  Molecule *in_stack_fffffffffffffe68;
  Vector3<double> *in_stack_fffffffffffffe70;
  Vector3<double> *in_stack_fffffffffffffe78;
  double local_140;
  Vector<double,_3U> local_138 [2];
  double local_108 [3];
  Vector3d *in_stack_ffffffffffffff10;
  Vector3d *in_stack_ffffffffffffff18;
  Thermo *in_stack_ffffffffffffff20;
  Molecule *local_d0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_c8;
  double local_c0;
  Vector<double,_3U> local_b8 [2];
  double local_88;
  Vector<double,_3U> local_80 [2];
  double local_50;
  Vector<double,_3U> local_48 [2];
  Snapshot *local_18;
  
  v1 = in_RDI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RSI->_vptr_Molecule);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_18->hasCOMw & 1U) == 0) {
    local_50 = 0.0;
    Vector<double,_3U>::Vector(local_48,&local_50);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe08);
    local_88 = 0.0;
    Vector<double,_3U>::Vector(local_80,&local_88);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe08);
    local_c0 = 0.0;
    Vector<double,_3U>::Vector(local_b8,&local_c0);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe08);
    getComAll(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_c8);
    local_108[0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)(local_108 + 1),local_108);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe08);
    local_140 = 0.0;
    Vector<double,_3U>::Vector(local_138,&local_140);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe08);
    local_d0 = SimInfo::beginMolecule(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    while (local_d0 != (Molecule *)0x0) {
      Molecule::getMass(in_RSI);
      Molecule::getCom(in_stack_fffffffffffffe68);
      OpenMD::operator-((Vector<double,_3U> *)v1,(Vector<double,_3U> *)in_RDI);
      Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)in_RDI);
      Molecule::getComVel(in_stack_fffffffffffffe68);
      OpenMD::operator-((Vector<double,_3U> *)v1,(Vector<double,_3U> *)in_RDI);
      OpenMD::operator*((Vector<double,_3U> *)v1,(double)in_RDI);
      Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)in_RDI);
      cross<double>(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe08);
      local_d0 = SimInfo::nextMolecule(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    Snapshot::setCOMw(in_RDI,(Vector3d *)in_stack_fffffffffffffe08);
  }
  Snapshot::getCOMw(in_stack_fffffffffffffe08);
  return (Vector3d *)v1;
}

Assistant:

Vector3d Thermo::getAngularMomentum() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasCOMw) {
      Vector3d com(0.0);
      Vector3d comVel(0.0);
      Vector3d angularMomentum(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d thisr(0.0);
      Vector3d thisp(0.0);

      RealType thisMass;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        thisMass = mol->getMass();
        thisr    = mol->getCom() - com;
        thisp    = (mol->getComVel() - comVel) * thisMass;

        angularMomentum += cross(thisr, thisp);
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
    }

    return snap->getCOMw();
  }